

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ROMInfo.cpp
# Opt level: O1

ROMInfo * MT32Emu::ROMInfo::getROMInfo(File *file)

{
  ROMInfo *pRVar1;
  long lVar2;
  undefined **ppuVar3;
  undefined8 *puVar4;
  
  if (getROMInfoLists()::CTRL_MT32_V1_04_A._48_8_ == 0) {
    getROMInfoLists()::CTRL_MT32_V1_04_A._48_8_ = getROMInfoLists()::CTRL_MT32_V1_04_B;
    getROMInfoLists()::CTRL_MT32_V1_05_A._48_8_ = getROMInfoLists()::CTRL_MT32_V1_05_B;
    getROMInfoLists()::CTRL_MT32_V1_06_A._48_8_ = getROMInfoLists()::CTRL_MT32_V1_06_B;
    getROMInfoLists()::CTRL_MT32_V1_07_A._48_8_ = getROMInfoLists()::CTRL_MT32_V1_07_B;
    getROMInfoLists()::CTRL_MT32_BLUER_A._48_8_ = getROMInfoLists()::CTRL_MT32_BLUER_B;
    getROMInfoLists()::PCM_MT32_L._48_8_ = getROMInfoLists()::PCM_MT32_H;
    getROMInfoLists()::PCM_CM32L_L._48_8_ = getROMInfoLists()::PCM_CM32L_H;
    ppuVar3 = &getROMInfoLists()::FULL_ROM_INFOS;
    puVar4 = &getROMInfoLists()::ALL_ROM_INFOS;
    for (lVar2 = 0xf; lVar2 != 0; lVar2 = lVar2 + -1) {
      *puVar4 = *ppuVar3;
      ppuVar3 = ppuVar3 + 1;
      puVar4 = puVar4 + 1;
    }
    ppuVar3 = &getROMInfoLists()::PARTIAL_ROM_INFOS;
    puVar4 = &DAT_001369d0;
    for (lVar2 = 0xf; lVar2 != 0; lVar2 = lVar2 + -1) {
      *puVar4 = *ppuVar3;
      ppuVar3 = ppuVar3 + 1;
      puVar4 = puVar4 + 1;
    }
  }
  pRVar1 = getROMInfo(file,(ROMInfo **)&getROMInfoLists()::ALL_ROM_INFOS);
  return pRVar1;
}

Assistant:

const ROMInfo *ROMInfo::getROMInfo(File *file) {
	return getROMInfo(file, getKnownROMInfoList());
}